

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Market.cpp
# Opt level: O0

bool __thiscall Market::insert(Market *this,Order *order)

{
  Side SVar1;
  double local_1d0;
  pair<const_double,_Order> local_1c8;
  _Base_ptr local_100;
  double local_e8;
  pair<const_double,_Order> local_e0;
  Order *local_18;
  Order *order_local;
  Market *this_local;
  
  local_18 = order;
  order_local = (Order *)this;
  SVar1 = Order::getSide(order);
  if (SVar1 == buy) {
    local_e8 = Order::getPrice(local_18);
    std::pair<const_double,_Order>::pair<double,_true>(&local_e0,&local_e8,local_18);
    local_100 = (_Base_ptr)
                std::
                multimap<double,_Order,_std::greater<double>,_std::allocator<std::pair<const_double,_Order>_>_>
                ::insert(&this->m_bidOrders,&local_e0);
    std::pair<const_double,_Order>::~pair(&local_e0);
  }
  else {
    local_1d0 = Order::getPrice(local_18);
    std::pair<const_double,_Order>::pair<double,_true>(&local_1c8,&local_1d0,local_18);
    std::
    multimap<double,_Order,_std::less<double>,_std::allocator<std::pair<const_double,_Order>_>_>::
    insert(&this->m_askOrders,&local_1c8);
    std::pair<const_double,_Order>::~pair(&local_1c8);
  }
  return true;
}

Assistant:

bool Market::insert(const Order &order) {
  if (order.getSide() == Order::buy) {
    m_bidOrders.insert(BidOrders::value_type(order.getPrice(), order));
  } else {
    m_askOrders.insert(AskOrders::value_type(order.getPrice(), order));
  }
  return true;
}